

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_file_reader.hpp
# Opt level: O2

void __thiscall duckdb::BaseFileReader::BaseFileReader(BaseFileReader *this,OpenFileInfo *file_p)

{
  this->_vptr_BaseFileReader = (_func_int **)&PTR__BaseFileReader_027b76d0;
  OpenFileInfo::OpenFileInfo(&this->file,file_p);
  (this->file_list_idx).index = 0xffffffffffffffff;
  (this->columns).
  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  .
  super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->columns).
  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  .
  super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->columns).
  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  .
  super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->column_ids).column_ids.
  super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>.
  super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->column_ids).column_ids.
  super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>.
  super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->column_ids).column_ids.
  super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>.
  super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->column_indexes).super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
  super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->column_indexes).super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
  super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->column_indexes).super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
  super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filters).
  super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>.
  super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl = (TableFilterSet *)0x0;
  (this->expression_map)._M_h._M_buckets = &(this->expression_map)._M_h._M_single_bucket;
  (this->expression_map)._M_h._M_bucket_count = 1;
  (this->expression_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->expression_map)._M_h._M_element_count = 0;
  (this->expression_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->expression_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->expression_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->cast_map)._M_h._M_buckets = &(this->cast_map)._M_h._M_single_bucket;
  (this->cast_map)._M_h._M_bucket_count = 1;
  (this->cast_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->cast_map)._M_h._M_element_count = 0;
  (this->cast_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->cast_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->cast_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->deletion_filter).
  super_unique_ptr<duckdb::DeleteFilter,_std::default_delete<duckdb::DeleteFilter>_>._M_t.
  super___uniq_ptr_impl<duckdb::DeleteFilter,_std::default_delete<duckdb::DeleteFilter>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DeleteFilter_*,_std::default_delete<duckdb::DeleteFilter>_>.
  super__Head_base<0UL,_duckdb::DeleteFilter_*,_false>._M_head_impl = (DeleteFilter *)0x0;
  return;
}

Assistant:

explicit BaseFileReader(OpenFileInfo file_p) : file(std::move(file_p)) {
	}